

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O1

void __thiscall zmq::session_base_t::engine_ready(session_base_t *this)

{
  byte bVar1;
  pipe_t *ppVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  undefined4 extraout_var_00;
  bool conflates [2];
  pipe_t *pipes [2];
  object_t *parents [2];
  int hwms [2];
  bool local_ea;
  byte local_e9;
  pipe_t *local_e8;
  pipe_t *ppStack_e0;
  session_base_t *local_d8;
  socket_base_t *local_d0;
  undefined1 local_c0 [32];
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  endpoint_type_t local_80;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  endpoint_type_t local_38;
  int local_30;
  int local_2c;
  undefined4 extraout_var;
  
  if (this->_pipe == (pipe_t *)0x0) {
    bVar3 = own_t::is_terminating(&this->super_own_t);
    if (!bVar3) {
      local_d0 = this->_socket;
      local_e8 = (pipe_t *)0x0;
      ppStack_e0 = (pipe_t *)0x0;
      if (((this->super_own_t).options.conflate == true) &&
         (bVar1 = (this->super_own_t).options.type, bVar1 < 9)) {
        uVar4 = 0x1a6 >> (bVar1 & 0x1f);
      }
      else {
        uVar4 = 0;
      }
      local_ea = (bool)((byte)uVar4 & 1);
      bVar3 = (uVar4 & 1) != 0;
      local_30 = (this->super_own_t).options.rcvhwm;
      if (bVar3) {
        local_30 = -1;
      }
      local_2c = -1;
      if (!bVar3) {
        local_2c = (this->super_own_t).options.sndhwm;
      }
      local_e9 = local_ea;
      local_d8 = this;
      iVar5 = pipepair((object_t **)&local_d8,&local_e8,&local_30,&local_ea);
      if (iVar5 != 0) {
        engine_ready();
      }
      pipe_t::set_event_sink(local_e8,&this->super_i_pipe_events);
      if (this->_pipe != (pipe_t *)0x0) {
        engine_ready();
      }
      ppVar2 = local_e8;
      this->_pipe = local_e8;
      iVar5 = (*this->_engine->_vptr_i_engine[8])();
      plVar6 = (long *)CONCAT44(extraout_var,iVar5);
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)local_78,*plVar6,plVar6[1] + *plVar6);
      local_58._M_p = (pointer)&local_48;
      std::__cxx11::string::_M_construct<char*>((string *)&local_58,plVar6[4],plVar6[5] + plVar6[4])
      ;
      local_38 = *(endpoint_type_t *)(plVar6 + 8);
      pipe_t::set_endpoint_pair(ppVar2,(endpoint_uri_pair_t *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      ppVar2 = ppStack_e0;
      iVar5 = (*this->_engine->_vptr_i_engine[8])();
      plVar6 = (long *)CONCAT44(extraout_var_00,iVar5);
      local_c0._0_8_ = local_c0 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)local_c0,*plVar6,plVar6[1] + *plVar6);
      local_a0._M_p = (pointer)&local_90;
      std::__cxx11::string::_M_construct<char*>((string *)&local_a0,plVar6[4],plVar6[5] + plVar6[4])
      ;
      local_80 = *(endpoint_type_t *)(plVar6 + 8);
      pipe_t::set_endpoint_pair(ppVar2,(endpoint_uri_pair_t *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_p != &local_90) {
        operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
      object_t::send_bind((object_t *)this,&this->_socket->super_own_t,ppStack_e0,true);
    }
  }
  return;
}

Assistant:

void zmq::session_base_t::engine_ready ()
{
    //  Create the pipe if it does not exist yet.
    if (!_pipe && !is_terminating ()) {
        object_t *parents[2] = {this, _socket};
        pipe_t *pipes[2] = {NULL, NULL};

        const bool conflate = get_effective_conflate_option (options);

        int hwms[2] = {conflate ? -1 : options.rcvhwm,
                       conflate ? -1 : options.sndhwm};
        bool conflates[2] = {conflate, conflate};
        const int rc = pipepair (parents, pipes, hwms, conflates);
        errno_assert (rc == 0);

        //  Plug the local end of the pipe.
        pipes[0]->set_event_sink (this);

        //  Remember the local end of the pipe.
        zmq_assert (!_pipe);
        _pipe = pipes[0];

        //  The endpoints strings are not set on bind, set them here so that
        //  events can use them.
        pipes[0]->set_endpoint_pair (_engine->get_endpoint ());
        pipes[1]->set_endpoint_pair (_engine->get_endpoint ());

        //  Ask socket to plug into the remote end of the pipe.
        send_bind (_socket, pipes[1]);
    }
}